

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamespaceScope.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::NamespaceScope::addPrefix(NamespaceScope *this,XMLCh *prefixToAdd,uint uriId)

{
  uint uVar1;
  RefHashTableOf<xercesc_4_0::XMLStringPool::PoolElem,_xercesc_4_0::StringHasher> *pRVar2;
  StackElem *toExpand;
  PrefMapElem *pPVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  PoolElem *pPVar7;
  EmptyStackException *this_00;
  long lVar8;
  RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *pRVar9;
  XMLCh *pXVar10;
  XMLCh XVar11;
  
  if (this->fStackTop == 0) {
    this_00 = (EmptyStackException *)__cxa_allocate_exception(0x30);
    EmptyStackException::EmptyStackException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/NamespaceScope.cpp"
               ,0x9e,ElemStack_EmptyStack,this->fMemoryManager);
    __cxa_throw(this_00,&EmptyStackException::typeinfo,XMLException::~XMLException);
  }
  pRVar2 = (this->fPrefixPool).fHashTable;
  toExpand = this->fStack[this->fStackTop - 1];
  if ((prefixToAdd == (XMLCh *)0x0) || (uVar6 = (ulong)(ushort)*prefixToAdd, uVar6 == 0)) {
    uVar6 = 0;
  }
  else {
    XVar11 = prefixToAdd[1];
    if (XVar11 != L'\0') {
      pXVar10 = prefixToAdd + 2;
      do {
        uVar6 = (ulong)(ushort)XVar11 + (uVar6 >> 0x18) + uVar6 * 0x26;
        XVar11 = *pXVar10;
        pXVar10 = pXVar10 + 1;
      } while (XVar11 != L'\0');
    }
    uVar6 = uVar6 % pRVar2->fHashModulus;
  }
  pRVar9 = pRVar2->fBucketList[uVar6];
  if (pRVar9 != (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0) {
    do {
      bVar4 = StringHasher::equals((StringHasher *)&pRVar2->field_0x30,prefixToAdd,pRVar9->fKey);
      if (bVar4) goto LAB_0031c6bc;
      pRVar9 = pRVar9->fNext;
    } while (pRVar9 != (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0);
  }
  pRVar9 = (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0;
LAB_0031c6bc:
  if (pRVar9 == (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0) {
    pPVar7 = (PoolElem *)0x0;
  }
  else {
    pPVar7 = pRVar9->fData;
  }
  if (pPVar7 == (PoolElem *)0x0) {
    uVar5 = XMLStringPool::addNewEntry(&this->fPrefixPool,prefixToAdd);
  }
  else {
    uVar5 = pPVar7->fId;
  }
  uVar1 = toExpand->fMapCount;
  if (uVar1 != 0) {
    lVar8 = 0;
    do {
      if (toExpand->fMap[lVar8].fPrefId == uVar5) {
        toExpand->fMap[lVar8].fURIId = uriId;
        return;
      }
      lVar8 = lVar8 + 1;
    } while (uVar1 != (uint)lVar8);
  }
  if (uVar1 == toExpand->fMapCapacity) {
    expandMap(this,toExpand);
  }
  pPVar3 = toExpand->fMap;
  uVar1 = toExpand->fMapCount;
  pPVar3[uVar1].fPrefId = uVar5;
  pPVar3[uVar1].fURIId = uriId;
  toExpand->fMapCount = uVar1 + 1;
  return;
}

Assistant:

void NamespaceScope::addPrefix(const XMLCh* const prefixToAdd,
                               const unsigned int uriId) {

    if (!fStackTop)
        ThrowXMLwithMemMgr(EmptyStackException, XMLExcepts::ElemStack_EmptyStack, fMemoryManager);

    // Get a convenience pointer to the stack top row
    StackElem* curRow = fStack[fStackTop - 1];

    // Map the prefix to its unique id
    const unsigned int prefId = fPrefixPool.addOrFind(prefixToAdd);

    // Search the map at this level for the passed prefix
    for (unsigned int mapIndex = 0; mapIndex < curRow->fMapCount; mapIndex++)
    {
        if (curRow->fMap[mapIndex].fPrefId == prefId)
        {
            curRow->fMap[mapIndex].fURIId = uriId;
            return;
        }
    }

    //
    //  Add a new element to the prefix map for this element. If its full,
    //  then expand it out.
    //
    if (curRow->fMapCount == curRow->fMapCapacity)
        expandMap(curRow);

    //
    //  And now add a new element for this prefix.
    //
    curRow->fMap[curRow->fMapCount].fPrefId = prefId;
    curRow->fMap[curRow->fMapCount].fURIId = uriId;

    // Bump the map count now
    curRow->fMapCount++;
}